

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O1

void __thiscall Pl_LZWDecoder::sendNextCode(Pl_LZWDecoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint code;
  byte bVar5;
  uint uVar6;
  
  uVar1 = this->byte_pos;
  iVar4 = 8 - this->bit_pos;
  uVar2 = this->code_size - iVar4;
  uVar3 = 8;
  if (uVar2 < 8) {
    uVar3 = uVar2;
  }
  uVar6 = uVar1 + ((uVar1 + 1) / 3) * -3 + 1;
  bVar5 = 8 - (byte)uVar3;
  code = (((uint)(this->buf[uVar6] >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f)) +
         (((uint)this->buf[uVar1] & ~(-1 << ((byte)iVar4 & 0x1f))) << ((byte)uVar3 & 0x1f));
  if (8 < uVar2) {
    uVar3 = uVar2 - 8;
    if (uVar2 < 8) {
      uVar3 = 0;
    }
    uVar6 = (uVar1 + 2) % 3;
    bVar5 = 8 - (byte)uVar3;
    code = (code << ((byte)uVar3 & 0x1f)) +
           (((uint)(this->buf[uVar6] >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f));
  }
  this->byte_pos = uVar6;
  this->bit_pos = uVar3;
  if (uVar3 == 8) {
    this->bit_pos = 0;
    uVar6 = uVar6 + 1;
    if (uVar6 == 3) {
      uVar6 = 0;
    }
    this->byte_pos = uVar6;
  }
  this->bits_available = this->bits_available - this->code_size;
  handleCode(this,code);
  return;
}

Assistant:

void
Pl_LZWDecoder::sendNextCode()
{
    unsigned int high = this->byte_pos;
    unsigned int med = (this->byte_pos + 1) % 3;
    unsigned int low = (this->byte_pos + 2) % 3;

    unsigned int bits_from_high = 8 - this->bit_pos;
    unsigned int bits_from_med = this->code_size - bits_from_high;
    unsigned int bits_from_low = 0;
    if (bits_from_med > 8) {
        bits_from_low = bits_from_med - 8;
        bits_from_med = 8;
    }
    unsigned int high_mask = (1U << bits_from_high) - 1U;
    unsigned int med_mask = 0xff - ((1U << (8 - bits_from_med)) - 1U);
    unsigned int low_mask = 0xff - ((1U << (8 - bits_from_low)) - 1U);
    unsigned int code = 0;
    code += (this->buf[high] & high_mask) << bits_from_med;
    code += ((this->buf[med] & med_mask) >> (8 - bits_from_med));
    if (bits_from_low) {
        code <<= bits_from_low;
        code += ((this->buf[low] & low_mask) >> (8 - bits_from_low));
        this->byte_pos = low;
        this->bit_pos = bits_from_low;
    } else {
        this->byte_pos = med;
        this->bit_pos = bits_from_med;
    }
    if (this->bit_pos == 8) {
        this->bit_pos = 0;
        ++this->byte_pos;
        this->byte_pos %= 3;
    }
    this->bits_available -= this->code_size;

    handleCode(code);
}